

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_deblk_edge_filter.c
# Opt level: O1

void ihevc_deblk_luma_horz
               (UWORD8 *pu1_src,WORD32 src_strd,WORD32 bs,WORD32 quant_param_p,WORD32 quant_param_q,
               WORD32 beta_offset_div2,WORD32 tc_offset_div2,WORD32 filter_flag_p,
               WORD32 filter_flag_q)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  byte bVar15;
  byte bVar16;
  int iVar17;
  char cVar18;
  uint uVar19;
  uint uVar20;
  byte bVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  byte bVar26;
  byte bVar27;
  uint uVar28;
  long lVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  int iVar33;
  
  if (bs < 1) {
    __assert_fail("((bs > 0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/ihevc_deblk_edge_filter.c"
                  ,0x162,
                  "void ihevc_deblk_luma_horz(UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  if (filter_flag_q == 0 && filter_flag_p == 0) {
    __assert_fail("(filter_flag_p || filter_flag_q)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/ihevc_deblk_edge_filter.c"
                  ,0x163,
                  "void ihevc_deblk_luma_horz(UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  iVar6 = quant_param_p + quant_param_q + 1 >> 1;
  uVar19 = iVar6 + beta_offset_div2 * 2;
  if ((int)uVar19 < 1) {
    uVar19 = 0;
  }
  uVar4 = 0x33;
  if ((int)uVar19 < 0x33) {
    uVar4 = (ulong)uVar19;
  }
  uVar19 = (bs & 0x7ffffffeU) + iVar6 + tc_offset_div2 * 2;
  cVar18 = '\0';
  if ((int)uVar19 < 1) {
    uVar19 = 0;
  }
  uVar12 = 0x35;
  if ((int)uVar19 < 0x35) {
    uVar12 = (ulong)uVar19;
  }
  iVar6 = gai4_ihevc_tc_table[uVar12];
  if (iVar6 == 0) {
    return;
  }
  uVar19 = gai4_ihevc_beta_table[uVar4];
  lVar13 = (long)src_strd;
  bVar26 = *pu1_src;
  iVar7 = (uint)pu1_src[lVar13 * 2] + (uint)pu1_src[lVar13] * -2 + (uint)bVar26;
  iVar1 = -iVar7;
  if (0 < iVar7) {
    iVar1 = iVar7;
  }
  bVar21 = pu1_src[3];
  iVar10 = (uint)pu1_src[lVar13 * 2 + 3] + (uint)pu1_src[lVar13 + 3] * -2 + (uint)bVar21;
  iVar7 = -iVar10;
  if (0 < iVar10) {
    iVar7 = iVar10;
  }
  lVar3 = lVar13 * 2;
  lVar2 = lVar13 * 3;
  lVar29 = -lVar13;
  bVar27 = pu1_src[-lVar13];
  iVar11 = (uint)pu1_src[lVar13 * -3] + (uint)pu1_src[lVar13 * -2] * -2 + (uint)bVar27;
  iVar10 = -iVar11;
  if (0 < iVar11) {
    iVar10 = iVar11;
  }
  iVar30 = (uint)(pu1_src + -lVar13)[3] +
           (uint)pu1_src[3 - (long)(int)lVar2] + (uint)pu1_src[3 - (long)(int)lVar3] * -2;
  iVar11 = -iVar30;
  if (0 < iVar30) {
    iVar11 = iVar30;
  }
  bVar8 = true;
  bVar5 = true;
  if ((int)uVar19 <= iVar11 + iVar7 + iVar10 + iVar1) goto LAB_0015be98;
  if ((uint)((iVar10 + iVar1) * 2) < uVar19 >> 2) {
    iVar17 = (uint)pu1_src[lVar2] - (uint)bVar26;
    iVar30 = -iVar17;
    if (0 < iVar17) {
      iVar30 = iVar17;
    }
    iVar33 = (uint)bVar27 - (uint)pu1_src[lVar13 * -4];
    iVar17 = -iVar33;
    if (0 < iVar33) {
      iVar17 = iVar33;
    }
    if (uVar19 >> 3 <= (uint)(iVar17 + iVar30)) goto LAB_0015bdd9;
    iVar17 = (uint)bVar26 - (uint)bVar27;
    iVar30 = -iVar17;
    if (0 < iVar17) {
      iVar30 = iVar17;
    }
    bVar8 = iVar30 < iVar6 * 5 + 1 >> 1;
  }
  else {
LAB_0015bdd9:
    bVar8 = false;
  }
  if ((uint)((iVar11 + iVar7) * 2) < uVar19 >> 2) {
    iVar17 = (uint)pu1_src[lVar2 + 3] - (uint)bVar21;
    iVar30 = -iVar17;
    if (0 < iVar17) {
      iVar30 = iVar17;
    }
    iVar17 = (uint)pu1_src[lVar29 + 3] - (uint)pu1_src[lVar13 * -4 + 3];
    bVar26 = (byte)iVar17;
    bVar27 = -bVar26;
    if (0 < iVar17) {
      bVar27 = bVar26;
    }
    if (uVar19 >> 3 <= (uint)bVar27 + iVar30) goto LAB_0015be62;
    iVar17 = (uint)bVar21 - (uint)pu1_src[lVar29 + 3];
    iVar30 = -iVar17;
    if (0 < iVar17) {
      iVar30 = iVar17;
    }
    bVar5 = iVar30 < iVar6 * 5 + 1 >> 1;
  }
  else {
LAB_0015be62:
    bVar5 = false;
  }
  cVar18 = (bVar8 & bVar5) + 1;
  uVar19 = (uVar19 >> 1) + uVar19 >> 3;
  bVar8 = uVar19 <= (uint)(iVar11 + iVar10) || iVar6 < 2;
  bVar5 = uVar19 <= (uint)(iVar7 + iVar1) || iVar6 < 2;
LAB_0015be98:
  if (cVar18 != '\0') {
    iVar1 = iVar6 * 2;
    iVar7 = iVar6 >> 1;
    iVar10 = -iVar7;
    lVar14 = 0;
    do {
      bVar26 = pu1_src[lVar14 + lVar29];
      uVar31 = (uint)bVar26;
      bVar21 = pu1_src[lVar14 + lVar13 * -2];
      uVar28 = (uint)bVar21;
      bVar27 = pu1_src[lVar14 + lVar13 * -3];
      uVar20 = (uint)bVar27;
      bVar9 = pu1_src[lVar14];
      uVar24 = (uint)bVar9;
      bVar15 = pu1_src[lVar14 + lVar13];
      uVar19 = (uint)bVar15;
      bVar16 = pu1_src[lVar14 + lVar3];
      uVar32 = (uint)bVar16;
      if (cVar18 == '\x02') {
        iVar11 = uVar24 + uVar31 + uVar19;
        uVar22 = uVar28 + uVar32 + iVar11 * 2 + 4 >> 3;
        uVar25 = uVar24 + iVar6 * -2;
        if ((int)uVar25 < (int)uVar22) {
          uVar25 = uVar22;
        }
        if ((int)(iVar1 + uVar24) < (int)uVar22) {
          uVar25 = iVar1 + uVar24;
        }
        uVar23 = iVar11 + uVar32 + 2 >> 2;
        uVar22 = uVar19 + iVar6 * -2;
        if ((int)uVar22 < (int)uVar23) {
          uVar22 = uVar23;
        }
        if ((int)(iVar1 + uVar19) < (int)uVar23) {
          uVar22 = iVar1 + uVar19;
        }
        bVar15 = (byte)uVar22;
        uVar23 = uVar32 * 3 + iVar11 + (uint)pu1_src[lVar14 + lVar2] * 2 + 4 >> 3;
        uVar22 = uVar32 + iVar6 * -2;
        if ((int)uVar22 < (int)uVar23) {
          uVar22 = uVar23;
        }
        iVar11 = uVar24 + uVar31 + uVar28;
        uVar24 = uVar19 + uVar20 + iVar11 * 2 + 4 >> 3;
        uVar19 = uVar31 + iVar6 * -2;
        if ((int)uVar19 < (int)uVar24) {
          uVar19 = uVar24;
        }
        if ((int)(iVar1 + uVar31) < (int)uVar24) {
          uVar19 = iVar1 + uVar31;
        }
        uVar31 = uVar20 + iVar11 + 2 >> 2;
        uVar24 = uVar28 + iVar6 * -2;
        if ((int)uVar24 < (int)uVar31) {
          uVar24 = uVar31;
        }
        if ((int)(iVar1 + uVar28) < (int)uVar31) {
          uVar24 = iVar1 + uVar28;
        }
        uVar31 = uVar20 * 3 + iVar11 + (uint)pu1_src[lVar14 + src_strd * -4] * 2 + 4 >> 3;
        uVar28 = uVar20 + iVar6 * -2;
        if ((int)uVar28 < (int)uVar31) {
          uVar28 = uVar31;
        }
        if ((int)(iVar1 + uVar20) < (int)uVar31) {
          uVar28 = iVar1 + uVar20;
        }
        if ((int)(iVar1 + uVar32) < (int)uVar23) {
          uVar22 = iVar1 + uVar32;
        }
        bVar26 = (byte)uVar19;
        bVar21 = (byte)uVar24;
        bVar27 = (byte)uVar28;
        bVar9 = (byte)uVar25;
        bVar16 = (byte)uVar22;
      }
      else {
        iVar30 = (int)((uVar24 - uVar31) * 9 + (uVar19 - uVar28) * -3 + 8) >> 4;
        iVar11 = -iVar30;
        if (0 < iVar30) {
          iVar11 = iVar30;
        }
        if (iVar11 < iVar6 * 10) {
          iVar11 = -iVar6;
          if (-iVar6 < iVar30) {
            iVar11 = iVar30;
          }
          if (iVar6 < iVar30) {
            iVar11 = iVar6;
          }
          iVar30 = iVar11 + uVar31;
          if (iVar30 < 1) {
            iVar30 = 0;
          }
          if (0xfe < iVar30) {
            iVar30 = 0xff;
          }
          bVar26 = (byte)iVar30;
          iVar30 = uVar24 - iVar11;
          if (iVar30 < 1) {
            iVar30 = 0;
          }
          if (0xfe < iVar30) {
            iVar30 = 0xff;
          }
          bVar9 = (byte)iVar30;
          if (!bVar8) {
            iVar17 = (int)(((uVar20 + uVar31 + 1 >> 1 & 0xff) - uVar28) + iVar11) >> 1;
            iVar30 = iVar17;
            if (iVar17 <= iVar10) {
              iVar30 = iVar10;
            }
            if (iVar7 < iVar17) {
              iVar30 = iVar7;
            }
            iVar30 = iVar30 + uVar28;
            bVar21 = 0xff;
            if (iVar30 < 0x100) {
              if (iVar30 < 1) {
                iVar30 = 0;
              }
              bVar21 = (byte)iVar30;
            }
          }
          if (!bVar5) {
            iVar30 = (int)((uVar24 + uVar32 + 1 >> 1 & 0xff) - (iVar11 + uVar19)) >> 1;
            iVar11 = iVar30;
            if (iVar30 <= iVar10) {
              iVar11 = iVar10;
            }
            if (iVar7 < iVar30) {
              iVar11 = iVar7;
            }
            iVar11 = iVar11 + uVar19;
            if (iVar11 < 0x100) {
              if (iVar11 < 1) {
                iVar11 = 0;
              }
              bVar15 = (byte)iVar11;
            }
            else {
              bVar15 = 0xff;
            }
          }
        }
      }
      if (filter_flag_p != 0) {
        pu1_src[lVar14 + lVar13 * -3] = bVar27;
        pu1_src[lVar14 + lVar13 * -2] = bVar21;
        pu1_src[lVar14 + lVar29] = bVar26;
      }
      if (filter_flag_q != 0) {
        pu1_src[lVar14] = bVar9;
        pu1_src[lVar14 + lVar13] = bVar15;
        pu1_src[lVar14 + lVar3] = bVar16;
      }
      lVar14 = lVar14 + 1;
    } while ((int)lVar14 != 4);
  }
  return;
}

Assistant:

void ihevc_deblk_luma_horz(UWORD8 *pu1_src,
                           WORD32 src_strd,
                           WORD32 bs,
                           WORD32 quant_param_p,
                           WORD32 quant_param_q,
                           WORD32 beta_offset_div2,
                           WORD32 tc_offset_div2,
                           WORD32 filter_flag_p,
                           WORD32 filter_flag_q)
{
    WORD32 qp_luma, beta_indx, tc_indx;
    WORD32 beta, tc;
    WORD32 dp0, dp3, dq0, dq3, d0, d3, dp, dq, d;
    WORD32 d_sam0, d_sam3;
    WORD32 de, dep, deq;
    WORD32 col;
    WORD32 tmp_p0, tmp_p1, tmp_p2, tmp_q0, tmp_q1, tmp_q2;
    WORD32 delta, delta_p, delta_q;

    ASSERT((bs > 0));
    ASSERT(filter_flag_p || filter_flag_q);

    qp_luma = (quant_param_p + quant_param_q + 1) >> 1;
    beta_indx = CLIP3(qp_luma + (beta_offset_div2 << 1), 0, 51);

    /* BS based on implementation can take value 3 if it is intra/inter egde          */
    /* based on BS, tc index is calcuated by adding 2 * ( bs - 1) to QP and tc_offset */
    /* for BS = 1 adding factor is (0*2), BS = 2 or 3 adding factor is (1*2)          */
    /* the above desired functionallity is achieved by doing (2*(bs>>1))              */

    tc_indx = CLIP3(qp_luma + 2 * (bs >> 1) + (tc_offset_div2 << 1), 0, 53);

    beta = gai4_ihevc_beta_table[beta_indx];
    tc = gai4_ihevc_tc_table[tc_indx];
    if(0 == tc)
    {
        return;
    }

    dq0 = ABS(pu1_src[2 * src_strd] - 2 * pu1_src[1 * src_strd] +
                    pu1_src[0 * src_strd]);

    dq3 = ABS(pu1_src[3 + 2 * src_strd] - 2 * pu1_src[3 + 1 * src_strd] +
                    pu1_src[3 + 0 * src_strd]);

    dp0 = ABS(pu1_src[-3 * src_strd] - 2 * pu1_src[-2 * src_strd] +
                    pu1_src[-1 * src_strd]);

    dp3 = ABS(pu1_src[3 - 3 * src_strd] - 2 * pu1_src[3 - 2 * src_strd] +
                    pu1_src[3 - 1 * src_strd]);

    d0 = dp0 + dq0;
    d3 = dp3 + dq3;

    dp = dp0 + dp3;
    dq = dq0 + dq3;

    d = d0 + d3;

    de = 0;
    dep = 0;
    deq = 0;

    if(d < beta)
    {
        d_sam0 = 0;
        if((2 * d0 < (beta >> 2))
                        && (ABS(pu1_src[3 * src_strd] - pu1_src[0 * src_strd]) +
                                        ABS(pu1_src[-1 * src_strd] - pu1_src[-4 * src_strd])
                                        < (beta >> 3))
                        && ABS(pu1_src[0 * src_strd] - pu1_src[-1 * src_strd])
                        < ((5 * tc + 1) >> 1))
        {
            d_sam0 = 1;
        }

        pu1_src += 3;
        d_sam3 = 0;
        if((2 * d3 < (beta >> 2))
                        && (ABS(pu1_src[3 * src_strd] - pu1_src[0 * src_strd]) +
                                        ABS(pu1_src[-1 * src_strd] - pu1_src[-4 * src_strd])
                                        < (beta >> 3))
                        && ABS(pu1_src[0 * src_strd] - pu1_src[-1 * src_strd])
                        < ((5 * tc + 1) >> 1))
        {
            d_sam3 = 1;
        }
        pu1_src -= 3;

        de = (d_sam0 == 1 && d_sam3 == 1) ? 2 : 1;
        dep = (dp < ((beta + (beta >> 1)) >> 3)) ? 1 : 0;
        deq = (dq < ((beta + (beta >> 1)) >> 3)) ? 1 : 0;
        if(tc <= 1)
        {
            dep = 0;
            deq = 0;
        }
    }

    if(de != 0)
    {
        for(col = 0; col < 4; col++)
        {
            tmp_p0 = pu1_src[-1 * src_strd];
            tmp_p1 = pu1_src[-2 * src_strd];
            tmp_p2 = pu1_src[-3 * src_strd];

            tmp_q0 = pu1_src[0 * src_strd];
            tmp_q1 = pu1_src[1 * src_strd];
            tmp_q2 = pu1_src[2 * src_strd];
            if(de == 2)
            {
                tmp_q0 = CLIP3((pu1_src[2 * src_strd] +
                                2 * pu1_src[1 * src_strd] +
                                2 * pu1_src[0 * src_strd] +
                                2 * pu1_src[-1 * src_strd] +
                                pu1_src[-2 * src_strd] + 4) >> 3,
                                pu1_src[0 * src_strd] - 2 * tc,
                                pu1_src[0 * src_strd] + 2 * tc);

                tmp_q1 = CLIP3((pu1_src[2 * src_strd] +
                                pu1_src[1 * src_strd] +
                                pu1_src[0 * src_strd] +
                                pu1_src[-1 * src_strd] + 2) >> 2,
                                pu1_src[1 * src_strd] - 2 * tc,
                                pu1_src[1 * src_strd] + 2 * tc);

                tmp_q2 = CLIP3((2 * pu1_src[3 * src_strd] +
                                3 * pu1_src[2 * src_strd] +
                                pu1_src[1 * src_strd] +
                                pu1_src[0 * src_strd] +
                                pu1_src[-1 * src_strd] + 4) >> 3,
                                pu1_src[2 * src_strd] - 2 * tc,
                                pu1_src[2 * src_strd] + 2 * tc);

                tmp_p0 = CLIP3((pu1_src[1 * src_strd] +
                                2 * pu1_src[0 * src_strd] +
                                2 * pu1_src[-1 * src_strd] +
                                2 * pu1_src[-2 * src_strd] +
                                pu1_src[-3 * src_strd] + 4) >> 3,
                                pu1_src[-1 * src_strd] - 2 * tc,
                                pu1_src[-1 * src_strd] + 2 * tc);

                tmp_p1 = CLIP3((pu1_src[0 * src_strd] +
                                pu1_src[-1 * src_strd] +
                                pu1_src[-2 * src_strd] +
                                pu1_src[-3 * src_strd] + 2) >> 2,
                                pu1_src[-2 * src_strd] - 2 * tc,
                                pu1_src[-2 * src_strd] + 2 * tc);

                tmp_p2 = CLIP3((pu1_src[0 * src_strd] +
                                pu1_src[-1 * src_strd] +
                                pu1_src[-2 * src_strd] +
                                3 * pu1_src[-3 * src_strd] +
                                2 * pu1_src[-4 * src_strd] + 4) >> 3,
                                pu1_src[-3 * src_strd] - 2 * tc,
                                pu1_src[-3 * src_strd] + 2 * tc);
            }
            else
            {
                delta = (9 * (pu1_src[0 * src_strd] - pu1_src[-1 * src_strd]) -
                                3 * (pu1_src[1 * src_strd] - pu1_src[-2 * src_strd]) +
                                8) >> 4;
                if(ABS(delta) < 10 * tc)
                {
                    delta = CLIP3(delta, -tc, tc);

                    tmp_p0 = CLIP_U8(pu1_src[-1 * src_strd] + delta);
                    tmp_q0 = CLIP_U8(pu1_src[0 * src_strd] - delta);

                    if(dep == 1)
                    {
                        delta_p = CLIP3((((pu1_src[-3 * src_strd] +
                                        pu1_src[-1 * src_strd] + 1) >> 1) -
                                        pu1_src[-2 * src_strd] + delta) >> 1,
                                        -(tc >> 1),
                                        (tc >> 1));
                        tmp_p1 = CLIP_U8(pu1_src[-2 * src_strd] + delta_p);
                    }

                    if(deq == 1)
                    {
                        delta_q = CLIP3((((pu1_src[2 * src_strd] +
                                        pu1_src[0 * src_strd] + 1) >> 1) -
                                        pu1_src[1 * src_strd] - delta) >> 1,
                                        -(tc >> 1),
                                        (tc >> 1));
                        tmp_q1 = CLIP_U8(pu1_src[1 * src_strd] + delta_q);
                    }
                }
            }

            if(filter_flag_p != 0)
            {
                pu1_src[-3 * src_strd] = tmp_p2;
                pu1_src[-2 * src_strd] = tmp_p1;
                pu1_src[-1 * src_strd] = tmp_p0;
            }

            if(filter_flag_q != 0)
            {
                pu1_src[0 * src_strd] = tmp_q0;
                pu1_src[1 * src_strd] = tmp_q1;
                pu1_src[2 * src_strd] = tmp_q2;
            }

            pu1_src += 1;
        }
    }

}